

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

int gtStripContig(TIFFRGBAImage *img,uint32_t *raster,uint32_t w,uint32_t h)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  uint32_t *puVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  tmsize_t tVar8;
  char *module;
  uint uVar9;
  undefined4 in_register_0000000c;
  uint uVar10;
  char *fmt;
  uint32_t *puVar11;
  int iVar12;
  uint32_t uVar13;
  ulong uVar14;
  uint32_t *puVar15;
  TIFF *tif;
  ulong uVar16;
  TIFFRGBAImage *pTVar17;
  bool bVar18;
  uint16_t subsamplingver;
  uint local_a4;
  int local_a0;
  uint32_t rowsperstrip;
  ulong local_98;
  TIFFRGBAImage *local_90;
  ulong local_88;
  uchar *buf;
  uint16_t subsamplinghor;
  TIFF *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  uint32_t *local_50;
  tmsize_t local_48;
  anon_union_8_3_994a2fbf_for_put local_40;
  ulong local_38;
  
  local_98 = CONCAT44(in_register_0000000c,h);
  tif = img->tif;
  local_40 = img->put;
  buf = (uchar *)0x0;
  local_88 = (ulong)img->width;
  local_68 = 0;
  TIFFGetFieldDefaulted(tif,0x212,&subsamplinghor,&subsamplingver);
  if (subsamplingver == 0) {
    module = TIFFFileName(tif);
    fmt = "Invalid vertical YCbCr subsampling";
  }
  else {
    local_48 = TIFFStripSize(tif);
    local_a4 = setorientation(img);
    iVar12 = 0;
    if ((local_a4 & 1) != 0) {
      if ((int)w < 0) {
        module = TIFFFileName(tif);
        fmt = "Width overflow";
        goto LAB_0029f92e;
      }
      iVar12 = (int)local_98 + -1;
      local_68 = (ulong)(w * -2);
    }
    local_90 = img;
    TIFFGetFieldDefaulted(tif,0x116,&rowsperstrip);
    local_70 = tif;
    uVar7 = TIFFScanlineSize(tif);
    uVar14 = 0;
    uVar6 = (uint)local_88;
    local_88 = (ulong)(uVar6 - w);
    if (uVar6 < w) {
      local_88 = uVar14;
    }
    pTVar17 = local_90;
    uVar16 = (ulong)w;
    uVar5 = (ulong)w;
    puVar11 = raster;
    if ((int)local_98 == 0) {
      iVar12 = 1;
      goto LAB_0029f90a;
    }
    while( true ) {
      local_50 = puVar11;
      local_58 = uVar5;
      local_60 = uVar16;
      local_a0 = iVar12;
      tif = local_70;
      iVar12 = (int)uVar14;
      uVar13 = pTVar17->row_offset + iVar12;
      uVar10 = uVar13 % rowsperstrip;
      uVar9 = rowsperstrip - uVar10;
      uVar6 = (uint)local_98 - iVar12;
      if (uVar9 + iVar12 <= (uint)local_98) {
        uVar6 = uVar9;
      }
      iVar12 = (uint)subsamplingver - uVar6 % (uint)subsamplingver;
      if (uVar6 % (uint)subsamplingver == 0) {
        iVar12 = 0;
      }
      uVar16 = (ulong)(uVar10 + uVar6 + iVar12);
      if ((0 < (long)uVar7) &&
         (auVar1._8_8_ = 0, auVar1._0_8_ = uVar7,
         SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar1,0) < uVar16)) break;
      uVar13 = TIFFComputeStrip(local_70,uVar13,0);
      tVar8 = _TIFFReadEncodedStripAndAllocBuffer(tif,uVar13,&buf,local_48,uVar16 * uVar7);
      puVar4 = local_50;
      uVar3 = local_58;
      pTVar17 = local_90;
      iVar2 = local_a0;
      if (tVar8 == -1) {
        iVar12 = 0;
        if ((buf == (uchar *)0x0) || (iVar12 = 0, local_90->stoponerr != 0)) goto LAB_0029f88d;
      }
      local_38 = uVar14;
      (*local_40.any)(local_90);
      uVar9 = -uVar6;
      if ((local_a4 & 1) == 0) {
        uVar9 = uVar6;
      }
      local_a0 = iVar2 + uVar9;
      uVar14 = (ulong)(uVar6 + (int)local_38);
      iVar12 = local_a0;
      uVar16 = local_60;
      uVar5 = local_58;
      puVar11 = local_50;
      if ((uint)local_98 <= uVar6 + (int)local_38) goto code_r0x0029f881;
    }
    module = TIFFFileName(local_70);
    fmt = "Integer overflow in gtStripContig";
  }
LAB_0029f92e:
  TIFFErrorExtR(tif,module,fmt);
  return 0;
code_r0x0029f881:
  iVar12 = 1;
LAB_0029f88d:
  if (1 < local_a4) {
    uVar7 = 0;
    uVar14 = 0;
    do {
      puVar11 = puVar4 + (uint)((int)uVar14 * (int)uVar3);
      puVar15 = puVar11 + (local_60 - 1);
      if (puVar11 < puVar15) {
        puVar11 = puVar4 + uVar7 + 1;
        do {
          uVar13 = puVar11[-1];
          puVar11[-1] = *puVar15;
          *puVar15 = uVar13;
          puVar15 = puVar15 + -1;
          bVar18 = puVar11 < puVar15;
          puVar11 = puVar11 + 1;
        } while (bVar18);
      }
      uVar14 = uVar14 + 1;
      uVar7 = (ulong)(uint)((int)uVar7 + (int)uVar3);
    } while (uVar14 != (local_98 & 0xffffffff));
  }
LAB_0029f90a:
  _TIFFfreeExt(pTVar17->tif,buf);
  return iVar12;
}

Assistant:

static int gtStripContig(TIFFRGBAImage *img, uint32_t *raster, uint32_t w,
                         uint32_t h)
{
    TIFF *tif = img->tif;
    tileContigRoutine put = img->put.contig;
    uint32_t row, y, nrow, nrowsub, rowstoread;
    tmsize_t pos;
    unsigned char *buf = NULL;
    uint32_t rowsperstrip;
    uint16_t subsamplinghor, subsamplingver;
    uint32_t imagewidth = img->width;
    tmsize_t scanline;
    int32_t fromskew, toskew;
    int ret = 1, flip;
    tmsize_t maxstripsize;

    TIFFGetFieldDefaulted(tif, TIFFTAG_YCBCRSUBSAMPLING, &subsamplinghor,
                          &subsamplingver);
    if (subsamplingver == 0)
    {
        TIFFErrorExtR(tif, TIFFFileName(tif),
                      "Invalid vertical YCbCr subsampling");
        return (0);
    }

    maxstripsize = TIFFStripSize(tif);

    flip = setorientation(img);
    if (flip & FLIP_VERTICALLY)
    {
        if (w > INT_MAX)
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "Width overflow");
            return (0);
        }
        y = h - 1;
        toskew = -(int32_t)(w + w);
    }
    else
    {
        y = 0;
        toskew = -(int32_t)(w - w);
    }

    TIFFGetFieldDefaulted(tif, TIFFTAG_ROWSPERSTRIP, &rowsperstrip);

    scanline = TIFFScanlineSize(tif);
    fromskew = (w < imagewidth ? imagewidth - w : 0);
    for (row = 0; row < h; row += nrow)
    {
        uint32_t temp;
        rowstoread = rowsperstrip - (row + img->row_offset) % rowsperstrip;
        nrow = (row + rowstoread > h ? h - row : rowstoread);
        nrowsub = nrow;
        if ((nrowsub % subsamplingver) != 0)
            nrowsub += subsamplingver - nrowsub % subsamplingver;
        temp = (row + img->row_offset) % rowsperstrip + nrowsub;
        if (scanline > 0 && temp > (size_t)(TIFF_TMSIZE_T_MAX / scanline))
        {
            TIFFErrorExtR(tif, TIFFFileName(tif),
                          "Integer overflow in gtStripContig");
            return 0;
        }
        if (_TIFFReadEncodedStripAndAllocBuffer(
                tif, TIFFComputeStrip(tif, row + img->row_offset, 0),
                (void **)(&buf), maxstripsize,
                temp * scanline) == (tmsize_t)(-1) &&
            (buf == NULL || img->stoponerr))
        {
            ret = 0;
            break;
        }

        pos = ((row + img->row_offset) % rowsperstrip) * scanline +
              ((tmsize_t)img->col_offset * img->samplesperpixel);
        tmsize_t roffset = (tmsize_t)y * w;
        (*put)(img, raster + roffset, 0, y, w, nrow, fromskew, toskew,
               buf + pos);
        y += ((flip & FLIP_VERTICALLY) ? -(int32_t)nrow : (int32_t)nrow);
    }

    if (flip & FLIP_HORIZONTALLY)
    {
        uint32_t line;

        for (line = 0; line < h; line++)
        {
            uint32_t *left = raster + (line * w);
            uint32_t *right = left + w - 1;

            while (left < right)
            {
                uint32_t temp = *left;
                *left = *right;
                *right = temp;
                left++;
                right--;
            }
        }
    }

    _TIFFfreeExt(img->tif, buf);
    return (ret);
}